

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsUtils.cpp
# Opt level: O2

bool updateValueDistribution(double value,HighsValueDistribution *value_distribution)

{
  int *piVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  HighsInt i;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  
  iVar2 = value_distribution->num_count_;
  lVar4 = (long)iVar2;
  if (-1 < lVar4) {
    value_distribution->sum_count_ = value_distribution->sum_count_ + 1;
    dVar8 = ABS(value);
    uVar6 = -(ulong)(value_distribution->min_value_ < dVar8);
    uVar7 = -(ulong)(dVar8 < value_distribution->max_value_);
    value_distribution->min_value_ =
         (double)(~uVar6 & (ulong)dVar8 | (ulong)value_distribution->min_value_ & uVar6);
    value_distribution->max_value_ =
         (double)(~uVar7 & (ulong)dVar8 | (ulong)value_distribution->max_value_ & uVar7);
    if ((value != 0.0) || (NAN(value))) {
      if ((dVar8 != 1.0) || (NAN(dVar8))) {
        lVar3 = 0;
        do {
          lVar5 = lVar3;
          if (lVar4 == lVar5) {
            piVar1 = (value_distribution->count_).super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar4;
            *piVar1 = *piVar1 + 1;
            goto LAB_0036580f;
          }
          lVar3 = lVar5 + 1;
        } while ((value_distribution->limit_).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar5] <= dVar8);
        piVar1 = (value_distribution->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar5;
        *piVar1 = *piVar1 + 1;
      }
      else {
        value_distribution->num_one_ = value_distribution->num_one_ + 1;
      }
    }
    else {
      value_distribution->num_zero_ = value_distribution->num_zero_ + 1;
    }
  }
LAB_0036580f:
  return -1 < iVar2;
}

Assistant:

bool updateValueDistribution(const double value,
                             HighsValueDistribution& value_distribution) {
  if (value_distribution.num_count_ < 0) return false;
  value_distribution.sum_count_++;
  const double abs_value = fabs(value);
  value_distribution.min_value_ =
      std::min(abs_value, value_distribution.min_value_);
  value_distribution.max_value_ =
      std::max(abs_value, value_distribution.max_value_);
  if (!abs_value) {
    value_distribution.num_zero_++;
    return true;
  }
  if (abs_value == 1.0) {
    value_distribution.num_one_++;
    return true;
  }
  for (HighsInt i = 0; i < value_distribution.num_count_; i++) {
    if (abs_value < value_distribution.limit_[i]) {
      value_distribution.count_[i]++;
      return true;
    }
  }
  value_distribution.count_[value_distribution.num_count_]++;
  return true;
}